

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3377::ProfileDataTest_StartStopEmpty_Test::TestBody
          (ProfileDataTest_StartStopEmpty_Test *this)

{
  ProfileData *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *in_R9;
  pointer *__ptr;
  char *pcVar3;
  ProfileDataSlot PStack_b8;
  ProfileDataSlot slots [8];
  Options options;
  string local_68;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  PStack_b8 = 0;
  slots[1] = 0;
  slots[6] = 0;
  slots[3] = 0;
  slots[4] = 0;
  slots[0] = 3;
  slots[2] = 1000000;
  slots[5] = 1;
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  ProfileData::Options::Options((Options *)((long)slots + 0x3c));
  slots[7]._4_4_ = 1;
  this_00 = &(this->super_ProfileDataTest).collector_;
  pcVar2 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,
             pcVar2 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  local_48[0] = (internal)
                ProfileData::Start(this_00,local_68._M_dataplus._M_p,(Options *)((long)slots + 0x3c)
                                  );
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    if ((bool)local_48[0]) goto LAB_0010b372;
  }
  else {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    if (((byte)local_48[0] & 1) != 0) goto LAB_0010b372;
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_68,local_48,
             (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
             ,0x177,local_68._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff90,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
LAB_0010b372:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Stop(this_00);
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
            (&local_68,(this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_48,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x17b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  (anonymous_namespace)::ProfileDataChecker::CheckWithSkips_abi_cxx11_
            (&local_68,(this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p,&PStack_b8,
             8,(int *)0x0,0);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_48,"kNoError","checker_.Check(slots, (sizeof(slots) / sizeof(*(slots))))",
             (char (*) [1])"",&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x17c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartStopEmpty) {
  const int frequency = 1;
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}